

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O0

size_t ggml_backend_buft_get_alloc_size(ggml_backend_buffer_type_t buft,ggml_tensor *tensor)

{
  size_t sVar1;
  undefined8 in_RSI;
  long in_RDI;
  size_t size;
  ggml_tensor *in_stack_fffffffffffffff8;
  
  if (*(long *)(in_RDI + 0x20) == 0) {
    sVar1 = ggml_nbytes(in_stack_fffffffffffffff8);
  }
  else {
    sVar1 = (**(code **)(in_RDI + 0x20))(in_RDI,in_RSI);
  }
  return sVar1;
}

Assistant:

size_t ggml_backend_buft_get_alloc_size(ggml_backend_buffer_type_t buft, struct ggml_tensor * tensor) {
    // get_alloc_size is optional, defaults to ggml_nbytes
    if (buft->iface.get_alloc_size) {
        size_t size = buft->iface.get_alloc_size(buft, tensor);
        assert(size >= ggml_nbytes(tensor));
        return size;
    }
    return ggml_nbytes(tensor);
}